

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# match.h
# Opt level: O0

bool __thiscall
wasm::Match::Internal::Matcher<wasm::Match::Internal::NumberLitKind>::matches
          (Matcher<wasm::Match::Internal::NumberLitKind> *this,
          candidate_t<wasm::Match::Internal::NumberLitKind> *candidate)

{
  bool bVar1;
  bool local_ab;
  Literal local_90;
  Literal local_78;
  MatchSelf<wasm::Match::Internal::NumberLitKind> local_5d [13];
  Literal local_50;
  undefined1 local_38 [8];
  matched_t<wasm::Match::Internal::NumberLitKind> casted;
  candidate_t<wasm::Match::Internal::NumberLitKind> *candidate_local;
  Matcher<wasm::Match::Internal::NumberLitKind> *this_local;
  
  casted.type.id = (uintptr_t)candidate;
  wasm::Literal::Literal((Literal *)local_38);
  wasm::Literal::Literal(&local_50,candidate);
  bVar1 = dynCastCandidate<wasm::Match::Internal::NumberLitKind,_0>
                    (&local_50,(matched_t<wasm::Match::Internal::NumberLitKind> *)local_38);
  wasm::Literal::~Literal(&local_50);
  if (bVar1) {
    if (this->binder != (matched_t<wasm::Match::Internal::NumberLitKind> *)0x0) {
      wasm::Literal::operator=(this->binder,(Literal *)local_38);
    }
    wasm::Literal::Literal(&local_78,(Literal *)local_38);
    bVar1 = MatchSelf<wasm::Match::Internal::NumberLitKind>::operator()
                      (local_5d,&local_78,this->data);
    local_ab = false;
    if (bVar1) {
      wasm::Literal::Literal(&local_90,(Literal *)local_38);
      local_ab = Components<wasm::Match::Internal::NumberLitKind,_0,_void>::match(&local_90);
    }
    this_local._7_1_ = local_ab;
    if (bVar1) {
      wasm::Literal::~Literal(&local_90);
    }
    wasm::Literal::~Literal(&local_78);
  }
  else {
    this_local._7_1_ = false;
  }
  wasm::Literal::~Literal((Literal *)local_38);
  return this_local._7_1_;
}

Assistant:

inline bool matches(candidate_t<Kind> candidate) {
    matched_t<Kind> casted;
    if (dynCastCandidate<Kind>(candidate, casted)) {
      if (binder != nullptr) {
        *binder = casted;
      }
      return MatchSelf<Kind>{}(casted, data) &&
             Components<Kind, 0, Matchers...>::match(casted, submatchers);
    }
    return false;
  }